

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O2

void rollback_with_num_keeping_headers(void)

{
  FILE *pFVar1;
  fdb_kvs_handle *pfVar2;
  fdb_status fVar3;
  sb_decision_t sVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_file_info file_info;
  char keybuf [256];
  fdb_config fconfig;
  char bodybuf [1024];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fconfig.compaction_threshold = '\0';
  fconfig.block_reusing_threshold = 0x41;
  fconfig.num_keeping_headers = 1;
  system("rm -rf  staleblktest* > errorlog.txt");
  fdb_open(&dbfile,"./staleblktest1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  uVar9 = 0;
  while (uVar9 != 10) {
    sprintf(keybuf,"%dkey",(ulong)uVar9);
    fillstr(bodybuf,'b',0x200);
    pfVar2 = db;
    sVar5 = strlen(keybuf);
    sVar6 = strlen(bodybuf);
    fVar3 = fdb_set_kv(pfVar2,keybuf,sVar5,bodybuf,sVar6);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x3d3);
      rollback_with_num_keeping_headers()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x3d3,"void rollback_with_num_keeping_headers()");
    }
    fVar3 = fdb_commit(dbfile,'\x01');
    pFVar1 = _stderr;
    uVar9 = uVar9 + 1;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x3d5);
      rollback_with_num_keeping_headers()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x3d5,"void rollback_with_num_keeping_headers()");
    }
  }
  uVar9 = 0;
  do {
    builtin_strncpy(keybuf,"0key",5);
    fillstr(bodybuf,'c',0x80);
    pfVar2 = db;
    sVar5 = strlen(keybuf);
    sVar6 = strlen(bodybuf);
    fVar3 = fdb_set_kv(pfVar2,keybuf,sVar5,bodybuf,sVar6);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x3df);
      rollback_with_num_keeping_headers()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x3df,"void rollback_with_num_keeping_headers()");
    }
    fVar3 = fdb_get_file_info(dbfile,&file_info);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x3e2);
      rollback_with_num_keeping_headers()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x3e2,"void rollback_with_num_keeping_headers()");
    }
    uVar9 = uVar9 + 1;
  } while (file_info.file_size < 0x1000000);
  sVar4 = sb_check_block_reusing(db);
  if (sVar4 != SBD_RECLAIM) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,1000);
    rollback_with_num_keeping_headers()::__test_pass = 1;
    __assert_fail("sb_decision == SBD_RECLAIM",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,1000,"void rollback_with_num_keeping_headers()");
  }
  fVar3 = fdb_commit(dbfile,'\x01');
  pFVar1 = _stderr;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    uVar8 = 0;
    while (uVar9 != uVar8) {
      sprintf(keybuf,"%dkey",(ulong)uVar8);
      fillstr(bodybuf,'d',0x200);
      pfVar2 = db;
      sVar5 = strlen(keybuf);
      sVar6 = strlen(bodybuf);
      fVar3 = fdb_set_kv(pfVar2,keybuf,sVar5,bodybuf,sVar6);
      pFVar1 = _stderr;
      uVar8 = uVar8 + 1;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pcVar7 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x3f4);
        rollback_with_num_keeping_headers()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x3f4,"void rollback_with_num_keeping_headers()");
      }
    }
    fVar3 = fdb_rollback(&db,10);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x3f9);
      rollback_with_num_keeping_headers()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x3f9,"void rollback_with_num_keeping_headers()");
    }
    fVar3 = fdb_get_kvs_info(db,&kvs_info);
    pFVar1 = _stderr;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      if (kvs_info.doc_count != 10) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x3fe);
        rollback_with_num_keeping_headers()::__test_pass = '\x01';
        if (kvs_info.doc_count != 10) {
          __assert_fail("kvs_info.doc_count == 10",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                        ,0x3fe,"void rollback_with_num_keeping_headers()");
        }
      }
      fVar3 = fdb_kvs_close(db);
      pFVar1 = _stderr;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        fVar3 = fdb_close(dbfile);
        pFVar1 = _stderr;
        if (fVar3 == FDB_RESULT_SUCCESS) {
          fdb_shutdown();
          memleak_end();
          pcVar7 = "%s PASSED\n";
          if (rollback_with_num_keeping_headers()::__test_pass != '\0') {
            pcVar7 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar7,"rollback with num keeping headers");
          return;
        }
        pcVar7 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x404);
        rollback_with_num_keeping_headers()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x404,"void rollback_with_num_keeping_headers()");
      }
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x402);
      rollback_with_num_keeping_headers()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x402,"void rollback_with_num_keeping_headers()");
    }
    pcVar7 = fdb_error_msg(fVar3);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x3fd);
    rollback_with_num_keeping_headers()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x3fd,"void rollback_with_num_keeping_headers()");
  }
  pcVar7 = fdb_error_msg(fVar3);
  fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x3ec);
  rollback_with_num_keeping_headers()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x3ec,"void rollback_with_num_keeping_headers()");
}

Assistant:

void rollback_with_num_keeping_headers() {
    TEST_INIT();
    memleak_start();

    int i, n, r;
    char keybuf[256];
    char bodybuf[1024];
    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_info kvs_info;
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 65;
    fconfig.num_keeping_headers = 1;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // create 10 headers
    for (i = 0; i < 10; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'b', 512);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        sprintf(keybuf, "0key");
        fillstr(bodybuf, 'c', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);
    n = i;

    // expect block reclaim
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    // reclaim old header via 11th commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // load unique keys to reuse old blocks
    for (i = 0; i < n; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'd', 512);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
    }

    // do rollback to 10th headers
    status = fdb_rollback(&db, 10);
    TEST_STATUS(status);

    // expect only 10 docs
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_STATUS(status);
    TEST_CHK(kvs_info.doc_count == 10);

    // cleanup
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("rollback with num keeping headers");
}